

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# D.c
# Opt level: O1

int envy_bios_parse_bit_D(envy_bios *bios,envy_bios_bit_entry *bit)

{
  byte bVar1;
  byte bVar2;
  ushort uVar3;
  int iVar4;
  int iVar5;
  envy_bios_D_unk2_entry *peVar6;
  uint16_t uVar7;
  long lVar8;
  ulong uVar9;
  int iVar10;
  uint idx;
  
  (bios->D).bit = bit;
  idx = 0;
  do {
    iVar4 = parse_at(bios,idx,(char **)0x0);
    idx = idx + 1;
  } while (iVar4 == 0);
  uVar3 = (bios->D).unk2.offset;
  if (uVar3 != 0) {
    if ((uint)uVar3 < bios->length) {
      (bios->D).unk2.version = bios->data[(uint)uVar3];
    }
    else {
      (bios->D).unk2.version = '\0';
      fprintf(_stderr,"requested OOB u8 at 0x%04x\n");
    }
    if ((bios->D).unk2.version == ' ') {
      lVar8 = (ulong)(bios->D).unk2.offset + 1;
      if ((uint)lVar8 < bios->length) {
        (bios->D).unk2.hlen = bios->data[lVar8];
        iVar4 = 0;
      }
      else {
        (bios->D).unk2.hlen = '\0';
        fprintf(_stderr,"requested OOB u8 at 0x%04x\n");
        iVar4 = -0xe;
      }
      lVar8 = (ulong)(bios->D).unk2.offset + 2;
      if ((uint)lVar8 < bios->length) {
        (bios->D).unk2.rlen = bios->data[lVar8];
        iVar10 = 0;
      }
      else {
        (bios->D).unk2.rlen = '\0';
        fprintf(_stderr,"requested OOB u8 at 0x%04x\n");
        iVar10 = -0xe;
      }
      lVar8 = (ulong)(bios->D).unk2.offset + 3;
      if ((uint)lVar8 < bios->length) {
        (bios->D).unk2.entriesnum = bios->data[lVar8];
        iVar5 = 0;
      }
      else {
        (bios->D).unk2.entriesnum = '\0';
        fprintf(_stderr,"requested OOB u8 at 0x%04x\n");
        iVar5 = -0xe;
      }
      (bios->D).unk2.valid = (iVar10 == 0 && iVar4 == 0) && iVar5 == 0;
      bVar1 = (bios->D).unk2.entriesnum;
      peVar6 = (envy_bios_D_unk2_entry *)malloc((ulong)((uint)bVar1 + (uint)bVar1));
      (bios->D).unk2.entries = peVar6;
      if (bVar1 != 0) {
        bVar2 = (bios->D).unk2.rlen;
        uVar7 = (ushort)(bios->D).unk2.hlen + (bios->D).unk2.offset;
        uVar9 = 0;
        do {
          peVar6[uVar9].offset = uVar7;
          uVar7 = uVar7 + bVar2;
          uVar9 = uVar9 + 1;
        } while (bVar1 != uVar9);
      }
    }
    else {
      fprintf(_stderr,"Unknown UNK2 table version 0x%x\n");
    }
  }
  return 0;
}

Assistant:

int
envy_bios_parse_bit_D(struct envy_bios *bios, struct envy_bios_bit_entry *bit)
{
	struct envy_bios_D *d = &bios->D;
	unsigned int idx = 0;

	d->bit = bit;

	while (!parse_at(bios, idx, NULL))
		idx++;

	/* parse tables */
	envy_bios_parse_D_unk2(bios);

	return 0;
}